

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * flatbuffers::IntToStringHex<unsigned_char>(string *__return_storage_ptr__,uchar i)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  stringstream ss;
  long local_188 [2];
  undefined8 auStack_178 [45];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(undefined8 *)((long)auStack_178 + *(long *)(local_188[0] + -0x18)) = 2;
  poVar3 = std::operator<<(local_188,0x30);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
  std::operator<<(poVar3,i);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToStringHex(T i) {
  std::stringstream ss;
  ss << std::setw(sizeof(T) * 2)
     << std::setfill('0')
     << std::hex
     << std::uppercase
     << i;
  return ss.str();
}